

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bezier.h
# Opt level: O2

double __thiscall bezier::Vec2::operator[](Vec2 *this,size_t axis)

{
  if (axis < 2) {
    return (&this->x)[(uint)axis & 1];
  }
  __assert_fail("axis < Vec2::size",
                "/workspace/llm4binary/github/license_c_cmakelists/oysteinmyrmo[P]bezier/include/bezier/bezier.h"
                ,0xe5,"double bezier::Vec2::operator[](size_t) const");
}

Assistant:

double operator[](size_t axis) const
        {
            assert(axis < Vec2::size);
            switch (axis)
            {
                case 0:
                    return x;
                case 1:
                    return y;
                default:
                    return 0;
            }
        }